

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_TestShell::
~TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_TestShell
          (TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_TestShell *this)

{
  TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_TestShell *this_local;
  
  ~TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleMultipleCallsWithParameters)
{
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");

    mock().checkExpectations();
}